

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_outbound_item * session_sched_get_next_outbound_item(nghttp2_session *session)

{
  nghttp2_pq_entry *pnVar1;
  nghttp2_stream *stream;
  nghttp2_pq_entry *ent;
  size_t i;
  nghttp2_session *session_local;
  
  ent = (nghttp2_pq_entry *)0x0;
  while( true ) {
    if ((nghttp2_pq_entry *)0x7 < ent) {
      return (nghttp2_outbound_item *)0x0;
    }
    pnVar1 = nghttp2_pq_top(&session->sched[(long)ent].ob_data);
    if (pnVar1 != (nghttp2_pq_entry *)0x0) break;
    ent = (nghttp2_pq_entry *)((long)&ent->index + 1);
  }
  return (nghttp2_outbound_item *)pnVar1[0x13].index;
}

Assistant:

static nghttp2_outbound_item *
session_sched_get_next_outbound_item(nghttp2_session *session) {
  size_t i;
  nghttp2_pq_entry *ent;
  nghttp2_stream *stream;

  for (i = 0; i < NGHTTP2_EXTPRI_URGENCY_LEVELS; ++i) {
    ent = nghttp2_pq_top(&session->sched[i].ob_data);
    if (!ent) {
      continue;
    }

    stream = nghttp2_struct_of(ent, nghttp2_stream, pq_entry);
    return stream->item;
  }

  return NULL;
}